

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

ssize_t __thiscall xmrig::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  pair<const_long,_xmrig::BaseClient::SendResult> local_58;
  
  iVar1 = (*(this->super_BaseClient).super_IClient._vptr_IClient[0xf])();
  local_58.first = CONCAT44(extraout_var,iVar1);
  BaseClient::SendResult::SendResult(&local_58.second,(Callback *)__buf);
  std::
  _Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
  ::_M_insert_unique<std::pair<long_const,xmrig::BaseClient::SendResult>>
            ((_Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
              *)&(this->super_BaseClient).m_callbacks,&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58.second);
  iVar1 = (*(this->super_BaseClient).super_IClient._vptr_IClient[0xe])
                    (this,CONCAT44(in_register_00000034,__fd));
  return CONCAT44(extraout_var_00,iVar1);
}

Assistant:

int64_t xmrig::Client::send(const rapidjson::Value &obj, Callback callback)
{
    assert(obj["id"] == sequence());

    m_callbacks.insert({ sequence(), std::move(callback) });

    return send(obj);
}